

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcid.c
# Opt level: O2

FT_Error FT_Get_CID_From_Glyph_Index(FT_Face face,FT_UInt glyph_index,FT_UInt *cid)

{
  FT_Module_Requester p_Var1;
  uint in_EAX;
  FT_Error FVar2;
  FT_Module_Interface pvVar3;
  ulong uStack_28;
  FT_UInt c;
  
  uStack_28 = (ulong)in_EAX;
  FVar2 = 6;
  if (face != (FT_Face)0x0) {
    p_Var1 = ((face->driver->root).clazz)->get_interface;
    if (p_Var1 != (FT_Module_Requester)0x0) {
      pvVar3 = (*p_Var1)(&face->driver->root,"CID");
      if ((pvVar3 != (FT_Module_Interface)0x0) && (*(code **)((long)pvVar3 + 0x10) != (code *)0x0))
      {
        FVar2 = (**(code **)((long)pvVar3 + 0x10))(face,glyph_index,&c);
      }
    }
  }
  if (cid != (FT_UInt *)0x0) {
    *cid = c;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_CID_From_Glyph_Index( FT_Face   face,
                               FT_UInt   glyph_index,
                               FT_UInt  *cid )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_UInt   c = 0;


    if ( face )
    {
      FT_Service_CID  service;


      FT_FACE_FIND_SERVICE( face, service, CID );

      if ( service && service->get_cid_from_glyph_index )
        error = service->get_cid_from_glyph_index( face, glyph_index, &c);
    }

    if ( cid )
      *cid = c;

    return error;
  }